

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParallelSieve.cpp
# Opt level: O1

void __thiscall primesieve::ParallelSieve::sieve(ParallelSieve *this)

{
  unsigned_long *puVar1;
  unsigned_long *puVar2;
  unsigned_long uVar3;
  unsigned_long uVar4;
  future<primesieve::Array<unsigned_long,_6UL>_> *pfVar5;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var6;
  element_type *peVar7;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var8;
  int threads;
  int iVar9;
  uint64_t uVar10;
  undefined8 *puVar11;
  _Result<primesieve::Array<unsigned_long,_6UL>_> *p_Var12;
  long lVar13;
  int iVar14;
  future<primesieve::Array<unsigned_long,_6UL>_> *f;
  future<primesieve::Array<unsigned_long,_6UL>_> *this_00;
  _State_baseV2 *__tmp;
  Vector<std::future<primesieve::Array<unsigned_long,_6UL>_>,_std::allocator<std::future<primesieve::Array<unsigned_long,_6UL>_>_>_>
  futures;
  atomic<unsigned_long> a;
  uint64_t iters;
  uint64_t threadDist;
  shared_ptr<std::__future_base::_State_baseV2> __state;
  long *local_d0;
  Vector<std::future<primesieve::Array<unsigned_long,_6UL>_>,_std::allocator<std::future<primesieve::Array<unsigned_long,_6UL>_>_>_>
  local_c8;
  __basic_future<primesieve::Array<unsigned_long,_6UL>_> local_a8;
  undefined8 local_90;
  ulong local_88;
  uint64_t local_80;
  Array<unsigned_long,_6UL> local_78;
  long local_48;
  undefined8 local_40 [2];
  
  PrimeSieve::reset(&this->super_PrimeSieve);
  if ((this->super_PrimeSieve).start_ <= (this->super_PrimeSieve).stop_) {
    threads = idealNumThreads(this);
    if (threads == 1) {
      PrimeSieve::sieve(&this->super_PrimeSieve);
      return;
    }
    PrimeSieve::setStatus(&this->super_PrimeSieve,0.0);
    local_48 = std::chrono::_V2::system_clock::now();
    uVar10 = PrimeSieve::getDistance(&this->super_PrimeSieve);
    local_80 = getThreadDistance(this,threads);
    local_88 = (uVar10 - 1) / local_80 + 1;
    iVar9 = (int)local_88;
    if ((ulong)(long)threads <= local_88) {
      iVar9 = threads;
    }
    iVar14 = 1;
    if (threads != 0) {
      iVar14 = iVar9;
    }
    local_90 = 0;
    local_c8.capacity_ = (future<primesieve::Array<unsigned_long,_6UL>_> *)0x0;
    local_c8.array_ = (future<primesieve::Array<unsigned_long,_6UL>_> *)0x0;
    local_c8.end_ = (future<primesieve::Array<unsigned_long,_6UL>_> *)0x0;
    if ((long)iVar14 != 0) {
      Vector<std::future<primesieve::Array<unsigned_long,_6UL>_>,_std::allocator<std::future<primesieve::Array<unsigned_long,_6UL>_>_>_>
      ::reserve_unchecked(&local_c8,(long)iVar14);
    }
    peVar7 = local_a8._M_state.
             super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    _Var8._M_pi = local_a8._M_state.
                  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
    if (0 < iVar14) {
      do {
        local_a8._M_state.
        super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi = _Var8._M_pi;
        local_a8._M_state.
        super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             peVar7;
        local_78.array_[0] = 0;
        local_78.array_[1] = 0;
        puVar11 = (undefined8 *)operator_new(0x68);
        puVar11[1] = 0x100000001;
        *puVar11 = &PTR___Sp_counted_ptr_inplace_001867b0;
        *(undefined4 *)(puVar11 + 5) = 0;
        puVar11[3] = 0;
        *(undefined8 *)((long)puVar11 + 0x1d) = 0;
        puVar11[6] = 0;
        *(undefined4 *)(puVar11 + 7) = 0;
        puVar11[2] = &PTR___Async_state_impl_00186800;
        p_Var12 = (_Result<primesieve::Array<unsigned_long,_6UL>_> *)operator_new(0x48);
        std::__future_base::_Result<primesieve::Array<unsigned_long,_6UL>_>::_Result(p_Var12);
        puVar11[8] = p_Var12;
        puVar11[9] = this;
        puVar11[10] = &local_90;
        puVar11[0xb] = &local_88;
        puVar11[0xc] = &local_80;
        local_40[0] = 0;
        local_d0 = (long *)operator_new(0x20);
        *local_d0 = (long)&PTR___State_00186858;
        local_d0[1] = (long)(puVar11 + 2);
        local_d0[2] = (long)std::__future_base::
                            _Async_state_impl<std::thread::_Invoker<std::tuple<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/kimwalisch[P]primecount/lib/primesieve/src/ParallelSieve.cpp:153:17)>_>,_primesieve::Array<unsigned_long,_6UL>_>
                            ::_M_run;
        local_d0[3] = 0;
        std::thread::_M_start_thread(local_40,&local_d0,0);
        if (local_d0 != (long *)0x0) {
          (**(code **)(*local_d0 + 8))();
        }
        if (puVar11[6] != 0) {
          std::terminate();
        }
        puVar11[6] = local_40[0];
        uVar3 = local_78.array_[1];
        local_78.array_[1] = (unsigned_long)puVar11;
        local_78.array_[0] = (unsigned_long)(puVar11 + 2);
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar3 !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar3);
        }
        if (local_78.array_[0] == 0) {
          puVar11 = (undefined8 *)operator_new(0x58);
          puVar11[1] = 0x100000001;
          *puVar11 = &PTR___Sp_counted_ptr_inplace_00186898;
          *(undefined4 *)(puVar11 + 5) = 0;
          puVar11[3] = 0;
          *(undefined8 *)((long)puVar11 + 0x1d) = 0;
          puVar11[2] = &PTR___Deferred_state_001868e8;
          p_Var12 = (_Result<primesieve::Array<unsigned_long,_6UL>_> *)operator_new(0x48);
          std::__future_base::_Result<primesieve::Array<unsigned_long,_6UL>_>::_Result(p_Var12);
          puVar11[6] = p_Var12;
          puVar11[7] = this;
          puVar11[8] = &local_90;
          puVar11[9] = &local_88;
          puVar11[10] = &local_80;
          uVar3 = local_78.array_[1];
          local_78.array_[1] = (unsigned_long)puVar11;
          local_78.array_[0] = (unsigned_long)(puVar11 + 2);
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar3 !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar3);
          }
        }
        std::__basic_future<primesieve::Array<unsigned_long,_6UL>_>::__basic_future
                  (&local_a8,(__state_type *)&local_78);
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78.array_[1] !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78.array_[1]);
        }
        if (local_c8.end_ == local_c8.capacity_) {
          lVar13 = (long)local_c8.capacity_ - (long)local_c8.array_ >> 3;
          Vector<std::future<primesieve::Array<unsigned_long,_6UL>_>,_std::allocator<std::future<primesieve::Array<unsigned_long,_6UL>_>_>_>
          ::reserve_unchecked(&local_c8,lVar13 + (ulong)(lVar13 == 0));
        }
        _Var6._M_pi = local_a8._M_state.
                      super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount._M_pi;
        ((local_c8.end_)->super___basic_future<primesieve::Array<unsigned_long,_6UL>_>)._M_state.
        super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_a8._M_state.
        super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        _Var8._M_pi = local_a8._M_state.
                      super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount._M_pi;
        ((local_c8.end_)->super___basic_future<primesieve::Array<unsigned_long,_6UL>_>)._M_state.
        super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             local_a8._M_state.
             super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
        ((local_c8.end_)->super___basic_future<primesieve::Array<unsigned_long,_6UL>_>)._M_state.
        super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi = _Var6._M_pi;
        local_a8._M_state.
        super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        peVar7 = local_a8._M_state.
                 super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr;
        local_c8.end_ = local_c8.end_ + 1;
        local_a8._M_state.
        super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_a8._M_state.
        super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        iVar14 = iVar14 + -1;
      } while (iVar14 != 0);
    }
    pfVar5 = local_c8.end_;
    if (local_c8.array_ != local_c8.end_) {
      this_00 = local_c8.array_;
      do {
        std::future<primesieve::Array<unsigned_long,_6UL>_>::get(&local_78,this_00);
        lVar13 = 0;
        do {
          uVar3 = local_78.array_[lVar13 + 1];
          puVar1 = (this->super_PrimeSieve).counts_.array_ + lVar13;
          uVar4 = puVar1[1];
          puVar2 = (this->super_PrimeSieve).counts_.array_ + lVar13;
          *puVar2 = *puVar1 + local_78.array_[lVar13];
          puVar2[1] = uVar4 + uVar3;
          lVar13 = lVar13 + 2;
        } while (lVar13 != 6);
        this_00 = this_00 + 1;
      } while (this_00 != pfVar5);
    }
    lVar13 = std::chrono::_V2::system_clock::now();
    (this->super_PrimeSieve).seconds_ = (double)(lVar13 - local_48) / 1000000000.0;
    PrimeSieve::setStatus(&this->super_PrimeSieve,100.0);
    Vector<std::future<primesieve::Array<unsigned_long,_6UL>_>,_std::allocator<std::future<primesieve::Array<unsigned_long,_6UL>_>_>_>
    ::~Vector(&local_c8);
  }
  return;
}

Assistant:

void ParallelSieve::sieve()
{
  reset();

  if (start_ > stop_)
    return;

  int threads = idealNumThreads();

  if (threads == 1)
    PrimeSieve::sieve();
  else
  {
    setStatus(0);
    auto t1 = std::chrono::system_clock::now();
    uint64_t dist = getDistance();
    uint64_t threadDist = getThreadDistance(threads);
    uint64_t iters = ((dist - 1) / threadDist) + 1;
    threads = inBetween(1, threads, iters);
    std::atomic<uint64_t> a(0);

    // Each thread executes 1 task
    auto task = [&]()
    {
      PrimeSieve ps(this);
      uint64_t i;
      counts_t counts;
      counts.fill(0);

      while ((i = a.fetch_add(1, std::memory_order_relaxed)) < iters)
      {
        uint64_t start = start_ + threadDist * i;
        uint64_t stop = checkedAdd(start, threadDist);
        stop = align(stop);

        if (start > start_)
          start = align(start) + 1;

        // Sieve the primes inside [start, stop]
        ps.sieve(start, stop);
        counts += ps.getCounts();
      }

      return counts;
    };

    Vector<std::future<counts_t>> futures;
    futures.reserve(threads);

    for (int t = 0; t < threads; t++)
      futures.emplace_back(std::async(std::launch::async, task));

    for (auto& f : futures)
      counts_ += f.get();

    auto t2 = std::chrono::system_clock::now();
    std::chrono::duration<double> seconds = t2 - t1;
    seconds_ = seconds.count();
    setStatus(100);
  }
}